

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O2

Clause * __thiscall
Shell::EqualityProxyMono::createEqProxyAxiom(EqualityProxyMono *this,LiteralStack *literalStack)

{
  bool bVar1;
  Unit **ppUVar2;
  List<Kernel::Unit_*> *l;
  Clause *pCVar3;
  Literal **ppLVar4;
  TermList srt;
  DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> sorts;
  uint local_9c;
  NonspecificInferenceMany local_98;
  DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> local_88;
  Inference local_60;
  
  local_88._timestamp = 1;
  local_88._afterLast._4_4_ = 0;
  local_88._size = 0;
  local_88._deleted = 0;
  local_88._capacityIndex = 0;
  local_88._capacity = 0;
  local_88._20_8_ = 0;
  local_88._28_8_ = 0;
  l = (List<Kernel::Unit_*> *)0x0;
  for (ppLVar4 = literalStack->_cursor; ppLVar4 != literalStack->_stack; ppLVar4 = ppLVar4 + -1) {
    local_98._0_8_ = 2;
    local_9c = (ppLVar4[-1]->super_Term)._functor;
    bVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      (&s_proxyPredicateSorts,&local_9c,(TermList *)&local_98);
    if (bVar1) {
      bVar1 = Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(&local_88,local_98._0_8_);
      if (bVar1) {
        ppUVar2 = Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::get(&s_proxyPremises,(TermList)local_98._0_8_);
        l = Lib::List<Kernel::Unit_*>::cons(*ppUVar2,l);
      }
    }
  }
  local_98.rule = EQUALITY_PROXY_AXIOM2;
  local_98.premises = l;
  Kernel::Inference::Inference(&local_60,&local_98);
  pCVar3 = Kernel::Clause::fromStack(literalStack,&local_60);
  Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&local_88);
  return pCVar3;
}

Assistant:

Clause* EqualityProxyMono::createEqProxyAxiom(const LiteralStack& literalStack)
{
  DHSet<TermList> sorts;
  UnitList* prems = 0;

  LiteralStack::ConstIterator it(literalStack);
  while (it.hasNext()) {
    Literal* l = it.next();
    TermList srt;
    if (!s_proxyPredicateSorts.find(l->functor(),srt)) {
      continue;
    }
    if (!sorts.insert(srt)) {
      continue;
    }
    Unit* prem = s_proxyPremises.get(srt);
    ASS(prem);
    UnitList::push(prem, prems);
  }
  ASS(prems);
  Clause* res = Clause::fromStack(literalStack,NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_AXIOM2,prems));
  return res;
}